

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nibbler.cpp
# Opt level: O0

void __thiscall Nibbler::Nibbler(Nibbler *this,Nibbler *other)

{
  Nibbler *other_local;
  Nibbler *this_local;
  
  std::__cxx11::string::string((string *)this,(string *)other);
  this->_length = other->_length;
  this->_cursor = other->_cursor;
  return;
}

Assistant:

Nibbler::Nibbler (const Nibbler& other)
: _input (other._input)
, _length (other._length)
, _cursor (other._cursor)
{
}